

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O0

void YAML::Utils::anon_unknown_0::WriteDoubleQuoteEscapeSequence
               (ostream_wrapper *out,int codePoint,value stringEscapingStyle)

{
  pair<unsigned_short,_unsigned_short> stringEscapingStyle_00;
  int in_EDX;
  int in_ESI;
  pair<unsigned_short,_unsigned_short> surrogatePair;
  int digits;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar1;
  
  YAML::operator<<((ostream_wrapper *)CONCAT44(in_ESI,in_EDX),
                   (char (*) [2])CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  iVar1 = 8;
  if ((in_ESI < 0xff) && (in_EDX != 2)) {
    YAML::operator<<((ostream_wrapper *)CONCAT44(in_ESI,in_EDX),
                     (char (*) [2])CONCAT44(8,in_stack_ffffffffffffffe8));
    iVar1 = 2;
  }
  else if (in_ESI < 0xffff) {
    YAML::operator<<((ostream_wrapper *)CONCAT44(in_ESI,in_EDX),
                     (char (*) [2])CONCAT44(8,in_stack_ffffffffffffffe8));
    iVar1 = 4;
  }
  else {
    if (in_EDX == 2) {
      stringEscapingStyle_00 = EncodeUTF16SurrogatePair(2);
      WriteDoubleQuoteEscapeSequence
                ((ostream_wrapper *)CONCAT44(in_ESI,in_EDX),iVar1,(value)stringEscapingStyle_00);
      WriteDoubleQuoteEscapeSequence
                ((ostream_wrapper *)CONCAT44(in_ESI,in_EDX),iVar1,(value)stringEscapingStyle_00);
      return;
    }
    YAML::operator<<((ostream_wrapper *)CONCAT44(in_ESI,in_EDX),
                     (char (*) [2])CONCAT44(8,in_stack_ffffffffffffffe8));
    iVar1 = 8;
  }
  for (; 0 < iVar1; iVar1 = iVar1 + -1) {
    YAML::operator<<((ostream_wrapper *)CONCAT44(in_ESI,in_EDX),(char)((uint)iVar1 >> 0x18));
  }
  return;
}

Assistant:

void WriteDoubleQuoteEscapeSequence(ostream_wrapper& out, int codePoint, StringEscaping::value stringEscapingStyle) {
  static const char hexDigits[] = "0123456789abcdef";

  out << "\\";
  int digits = 8;
  if (codePoint < 0xFF && stringEscapingStyle != StringEscaping::JSON) {
    out << "x";
    digits = 2;
  } else if (codePoint < 0xFFFF) {
    out << "u";
    digits = 4;
  } else if (stringEscapingStyle != StringEscaping::JSON) {
    out << "U";
    digits = 8;
  } else {
    auto surrogatePair = EncodeUTF16SurrogatePair(codePoint);
    WriteDoubleQuoteEscapeSequence(out, surrogatePair.first, stringEscapingStyle);
    WriteDoubleQuoteEscapeSequence(out, surrogatePair.second, stringEscapingStyle);
    return;
  }

  // Write digits into the escape sequence
  for (; digits > 0; --digits)
    out << hexDigits[(codePoint >> (4 * (digits - 1))) & 0xF];
}